

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instructions_list.c
# Opt level: O1

void dec_esp(PDISASM pMyDisasm)

{
  Int32 *pIVar1;
  ulong uVar2;
  UIntPtr UVar3;
  
  if ((pMyDisasm->Reserved_).Architecture == 0x40) {
    uVar2 = (pMyDisasm->Reserved_).EndOfBlock;
    if ((uVar2 == 0) || ((pMyDisasm->Reserved_).EIP_ + 2 <= uVar2)) {
      (pMyDisasm->Reserved_).REX.W_ = '\x01';
      (pMyDisasm->Reserved_).REX.R_ = '\x01';
      (pMyDisasm->Reserved_).REX.X_ = '\0';
      (pMyDisasm->Reserved_).REX.B_ = '\0';
      (pMyDisasm->Reserved_).REX.state = '\x01';
      UVar3 = (pMyDisasm->Reserved_).EIP_;
      (pMyDisasm->Reserved_).EIP_ = UVar3 + 1;
      pIVar1 = &(pMyDisasm->Reserved_).NB_PREFIX;
      *pIVar1 = *pIVar1 + 1;
      (pMyDisasm->Prefix).Number = (pMyDisasm->Prefix).Number + 1;
      (pMyDisasm->Reserved_).OperandSize = 0x40;
      (pMyDisasm->Instruction).Opcode = (uint)*(byte *)(UVar3 + 1);
      (*opcode_map1[*(byte *)(UVar3 + 1)])(pMyDisasm);
      (pMyDisasm->Reserved_).OperandSize = 0x20;
    }
    else {
      (pMyDisasm->Reserved_).OutOfBlock = 1;
      (pMyDisasm->Reserved_).ERROR_OPCODE = -2;
    }
    return;
  }
  dec_args(pMyDisasm,4);
  return;
}

Assistant:

void __bea_callspec__ dec_esp(PDISASM pMyDisasm)
{
    if (GV.Architecture == 64) {
        if (!Security(2, pMyDisasm)) return;
        GV.REX.W_ = 1;
        GV.REX.R_ = 1;
        GV.REX.X_ = 0;
        GV.REX.B_ = 0;
        GV.REX.state = InUsePrefix;
        GV.EIP_++;
        GV.NB_PREFIX++;
        pMyDisasm->Prefix.Number++;
        GV.OperandSize = 64;
        pMyDisasm->Instruction.Opcode = *((UInt8*) GV.EIP_);
        (void) opcode_map1[*((UInt8*) GV.EIP_)](pMyDisasm);
        GV.OperandSize = 32;

    }
    else {
      dec_args(pMyDisasm, 4);
    }
}